

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManage.cpp
# Opt level: O1

uint get_memory(uint len,int type,uchar mid)

{
  uint uVar1;
  MemoryNode *pMVar2;
  uint uVar3;
  MemoryNode *pMVar4;
  MemoryNode *pMVar5;
  MemoryNode *p;
  MemoryNode *pMVar6;
  
  uVar3 = 0xffffffff;
  if (len != 0) {
    pMVar4 = code_used_memory_head;
    pMVar6 = code_free_memory_head;
    if ((type != 1) && (pMVar4 = data_used_memory_head, pMVar6 = data_free_memory_head, type != 0))
    {
      pMVar4 = (MemoryNode *)0x0;
      pMVar6 = (MemoryNode *)0x0;
    }
    for (; pMVar6 != (MemoryNode *)0x0; pMVar6 = pMVar6->next) {
      if (len <= pMVar6->size) goto LAB_00104cef;
    }
    pMVar6 = (MemoryNode *)0x0;
LAB_00104cef:
    if (pMVar6 != (MemoryNode *)0x0) {
      uVar3 = pMVar6->address;
      pMVar2 = (MemoryNode *)operator_new(0x20);
      pMVar2->address = pMVar6->address;
      pMVar2->size = len;
      pMVar2->mid = mid;
      do {
        pMVar5 = pMVar4;
        pMVar4 = pMVar5->next;
      } while (pMVar5->next != (MemoryNode *)0x0);
      pMVar5->next = pMVar2;
      pMVar2->forward = pMVar5;
      pMVar2->next = (MemoryNode *)0x0;
      uVar1 = pMVar6->size - len;
      if (uVar1 == 0) {
        pMVar4 = pMVar6->forward;
        pMVar6 = pMVar6->next;
        pMVar4->next = pMVar6;
        pMVar6->forward = pMVar4;
      }
      else {
        pMVar6->address = pMVar6->address + len;
        pMVar6->size = uVar1;
      }
    }
  }
  return uVar3;
}

Assistant:

EXPORT unsigned get_memory(unsigned len, int type,unsigned char mid) {
	MemoryNode *used_head = nullptr,*free_head = nullptr;
	if (!len) return-1;
	init_get_head(type, free_head, used_head);
	MemoryNode* p = find_memory(len,free_head);
	if (p != nullptr) {
		/*创建新的节点并把节点插入使用的最后*/
		unsigned adr = p->address;
		MemoryNode* new_used = new MemoryNode;
		new_used->address = p->address;
		new_used->size = len;
		new_used->mid = mid;
		MemoryNode* used_node = find_last_node(used_head);
		used_node->next = new_used;
		new_used->forward = used_node;
		new_used->next = nullptr;
		/*空闲块地址加 大小减小*/
		if (p->size == len) { //大小相等则取下节点
			MemoryNode *p_forword = p->forward;
			MemoryNode *p_next = p->next;
			p_forword->next = p_next;
			p_next->forward = p_forword;
		}
		else {
			p->address += len;
			p->size -= len;
		}
		return adr;
	}else return -1;
}